

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O0

void adios2::helper::ParseConfigYAMLIO
               (ADIOS *adios,string *configFileYAML,string *configFileContents,IO *io)

{
  bool bVar1;
  byte bVar2;
  __type _Var3;
  string *in_RDX;
  iterator_value *in_RDI;
  string ioName;
  Node ioScalar;
  Node *in_stack_00000258;
  ADIOS *in_stack_00000260;
  const_iterator itNode;
  Node document;
  string configFileContentsCopy;
  string hint;
  iterator_base<const_YAML::detail::iterator_value> *in_stack_fffffffffffffb98;
  iterator_value *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  undefined7 in_stack_fffffffffffffbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  Node *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int commRank;
  string *in_stack_fffffffffffffbe8;
  string *in_stack_fffffffffffffbf0;
  string *in_stack_fffffffffffffbf8;
  string *in_stack_fffffffffffffc00;
  Node *in_stack_fffffffffffffc18;
  string local_358 [80];
  iterator_base<const_YAML::detail::iterator_value> *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd48;
  allocator local_271;
  string local_270 [48];
  value in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  string *in_stack_fffffffffffffdc8;
  Node *in_stack_fffffffffffffdd0;
  string *in_stack_fffffffffffffdd8;
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [39];
  undefined1 local_141 [40];
  undefined1 local_119 [40];
  allocator local_f1;
  string local_f0 [96];
  string local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40 [40];
  string *local_18;
  iterator_value *local_8;
  
  __rhs = &local_60;
  local_18 = in_RDX;
  local_8 = in_RDI;
  std::operator+((char *)in_stack_fffffffffffffbe8,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                 (char *)in_stack_fffffffffffffba0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string(local_90,local_18);
  YAML::Load(in_stack_fffffffffffffd48);
  bVar1 = YAML::Node::operator!((Node *)0x9d7d5b);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"Helper",&local_f1);
    in_stack_fffffffffffffbc8 = (Node *)local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_119 + 1),"adiosYAML",(allocator *)in_stack_fffffffffffffbc8);
    in_stack_fffffffffffffbc0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_141;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_141 + 1),"ParseConfigYAML",(allocator *)in_stack_fffffffffffffbc0);
    std::operator+((char *)in_stack_fffffffffffffbe8,__rhs);
    commRank = (int)((ulong)__rhs >> 0x20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                   (char *)in_stack_fffffffffffffba0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffba0);
    Throw<std::invalid_argument>
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,
               in_stack_fffffffffffffbe8,commRank);
    std::__cxx11::string::~string(local_168);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string((string *)(local_141 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_141);
    std::__cxx11::string::~string((string *)(local_119 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_119);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  YAML::Node::begin(in_stack_fffffffffffffc18);
  while( true ) {
    YAML::Node::end(in_stack_fffffffffffffc18);
    bVar2 = YAML::detail::iterator_base<YAML::detail::iterator_value_const>::operator!=
                      ((iterator_base<const_YAML::detail::iterator_value> *)
                       in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
              ((iterator_base<const_YAML::detail::iterator_value> *)0x9d80db);
    if ((bVar2 & 1) == 0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_270,"IO",&local_271);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
              (in_stack_fffffffffffffcf8);
    anon_unknown_0::YAMLNode
              (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (bool)in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0);
    YAML::detail::iterator_value::~iterator_value(in_stack_fffffffffffffba0);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator((allocator<char> *)&local_271);
    bVar1 = YAML::Node::operator_cast_to_bool((Node *)0x9d81da);
    if (bVar1) {
      YAML::Node::as<std::__cxx11::string>(in_stack_fffffffffffffbc8);
      _Var3 = std::operator==(in_stack_fffffffffffffbc0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(bVar2,in_stack_fffffffffffffbb8));
      if (_Var3) {
        in_stack_fffffffffffffba0 = local_8;
        YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator*
                  (in_stack_fffffffffffffcf8);
        IOYAML(in_stack_00000260,in_stack_00000258,(IO *)ioScalar.m_pNode,
               (string *)
               ioScalar.m_pMemory.
               super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
        YAML::detail::iterator_value::~iterator_value(in_stack_fffffffffffffba0);
      }
      std::__cxx11::string::~string(local_358);
      if (!_Var3) goto LAB_009d8373;
    }
    else {
LAB_009d8373:
      _Var3 = false;
    }
    YAML::Node::~Node(&in_stack_fffffffffffffba0->super_Node);
    if (_Var3 != false) break;
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator++
              ((iterator_base<const_YAML::detail::iterator_value> *)in_stack_fffffffffffffba0);
  }
  YAML::detail::iterator_base<const_YAML::detail::iterator_value>::~iterator_base
            ((iterator_base<const_YAML::detail::iterator_value> *)0x9d83ca);
  YAML::Node::~Node(&in_stack_fffffffffffffba0->super_Node);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ParseConfigYAMLIO(core::ADIOS &adios, const std::string &configFileYAML,
                       const std::string &configFileContents, core::IO &io)
{
    const std::string hint =
        "when parsing config file " + configFileYAML + " in call to ADIOS constructor";

    // the following copy is needed because YAML::Load modifies configFileContents
    const std::string configFileContentsCopy = configFileContents;
    const YAML::Node document = YAML::Load(configFileContentsCopy);

    if (!document)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosYAML", "ParseConfigYAML",
            "parser error in file " + configFileYAML +
                " invalid format check with any YAML editor if format is "
                "ill-formed, " +
                hint);
    }

    for (auto itNode = document.begin(); itNode != document.end(); ++itNode)
    {
        const YAML::Node ioScalar =
            YAMLNode("IO", *itNode, hint, isNotMandatory, YAML::NodeType::Scalar);
        if (ioScalar)
        {
            const std::string ioName = ioScalar.as<std::string>();
            if (ioName == io.m_Name)
            {
                IOYAML(adios, *itNode, io, hint);
                return;
            }
        }
    }
}